

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pssw.c
# Opt level: O1

parasail_profile_t *
parasail_ssw_init(char *s1,int s1Len,parasail_matrix_t *matrix,int8_t score_size)

{
  void *pvVar1;
  parasail_profile_t *ppVar2;
  parasail_profile_t *__ptr;
  
  if ((score_size & 0xfdU) == 0) {
    ppVar2 = parasail_profile_create_8(s1,s1Len,matrix);
  }
  else {
    ppVar2 = (parasail_profile_t *)0x0;
  }
  if ((byte)(score_size - 1U) < 2) {
    __ptr = parasail_profile_create_16(s1,s1Len,matrix);
  }
  else {
    __ptr = (parasail_profile_t *)0x0;
  }
  if (__ptr == (parasail_profile_t *)0x0 || ppVar2 == (parasail_profile_t *)0x0) {
    if (ppVar2 == (parasail_profile_t *)0x0) {
      ppVar2 = __ptr;
    }
  }
  else {
    (ppVar2->profile16).similar = (__ptr->profile16).similar;
    pvVar1 = (__ptr->profile16).matches;
    (ppVar2->profile16).score = (__ptr->profile16).score;
    (ppVar2->profile16).matches = pvVar1;
    free(__ptr);
  }
  return ppVar2;
}

Assistant:

parasail_profile_t* parasail_ssw_init(
        const char * const restrict s1, const int s1Len,
        const parasail_matrix_t* matrix, const int8_t score_size)
{
    parasail_profile_t *profile8 = NULL;
    parasail_profile_t *profile16 = NULL;

    if (score_size == 0 || score_size == 2) {
        profile8 = parasail_profile_create_8(s1, s1Len, matrix);
    }
    if (score_size == 1 || score_size == 2) {
        profile16 = parasail_profile_create_16(s1, s1Len, matrix);
    }

    if (profile8 && profile16) {
        profile8->profile16 = profile16->profile16;
        free(profile16);
        return profile8;
    }
    else if (profile8) {
        return profile8;
    }
    else if (profile16) {
        return profile16;
    }

    return NULL;
}